

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidgetPrivate::reparentFocusChildren(QWidgetPrivate *this,FocusDirection direction)

{
  QWidget *pQVar1;
  bool bVar2;
  QWidget *pQVar3;
  QWidgetPrivate *pQVar4;
  QWidget *pQVar5;
  QWidgetPrivate *in_RDI;
  QWidget *prev;
  QWidget *topLevel;
  bool currentIsNew;
  QWidget *widget;
  bool prevWasNew;
  QWidget *lastNew;
  QWidget *lastOld;
  QWidget *firstOld;
  QWidget *q;
  QWidget *in_stack_ffffffffffffff40;
  QWidget *in_stack_ffffffffffffff48;
  QWidgetPrivate *in_stack_ffffffffffffff50;
  QWidget *local_40;
  bool local_31;
  QWidget *local_30;
  QWidget *local_28;
  QWidget *local_20;
  
  pQVar3 = q_func(in_RDI);
  local_20 = (QWidget *)0x0;
  local_28 = (QWidget *)0x0;
  local_31 = true;
  local_40 = nextPrevElementInFocusChain
                       (in_stack_ffffffffffffff50,
                        (FocusDirection)((ulong)in_stack_ffffffffffffff48 >> 0x20));
  local_30 = pQVar3;
  while (local_40 != pQVar3) {
    bVar2 = QWidget::isAncestorOf(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    if (bVar2) {
      if (local_31 == false) {
        pQVar4 = QWidget::d_func((QWidget *)0x374c3f);
        pQVar4->focus_next = local_40;
        pQVar4 = QWidget::d_func((QWidget *)0x374c65);
        pQVar4->focus_prev = local_30;
      }
      local_30 = local_40;
    }
    else {
      if (local_31 != false) {
        if (local_28 == (QWidget *)0x0) {
          local_20 = local_40;
        }
        else {
          pQVar4 = QWidget::d_func((QWidget *)0x374cb5);
          pQVar4->focus_next = local_40;
          pQVar4 = QWidget::d_func((QWidget *)0x374cdb);
          pQVar4->focus_prev = local_28;
        }
      }
      local_28 = local_40;
    }
    QWidget::d_func((QWidget *)0x374d18);
    local_40 = nextPrevElementInFocusChain
                         (in_stack_ffffffffffffff50,
                          (FocusDirection)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    local_31 = bVar2;
  }
  if (local_20 != (QWidget *)0x0) {
    pQVar4 = QWidget::d_func((QWidget *)0x374d69);
    pQVar4->focus_next = local_20;
    pQVar4 = QWidget::d_func((QWidget *)0x374d8f);
    pQVar4->focus_prev = local_28;
  }
  bVar2 = QWidget::isWindow(in_stack_ffffffffffffff40);
  if (bVar2) {
    pQVar4 = QWidget::d_func((QWidget *)0x374e80);
    pQVar4->focus_next = pQVar3;
    pQVar4 = QWidget::d_func((QWidget *)0x374ea6);
    pQVar4->focus_prev = local_30;
  }
  else {
    pQVar5 = QWidget::window((QWidget *)in_stack_ffffffffffffff50);
    pQVar4 = QWidget::d_func((QWidget *)0x374dcc);
    pQVar1 = pQVar4->focus_prev;
    pQVar4 = QWidget::d_func((QWidget *)0x374def);
    pQVar4->focus_prev = local_30;
    pQVar4 = QWidget::d_func((QWidget *)0x374e12);
    pQVar4->focus_next = pQVar3;
    pQVar4 = QWidget::d_func((QWidget *)0x374e35);
    pQVar4->focus_prev = pQVar1;
    pQVar4 = QWidget::d_func((QWidget *)0x374e58);
    pQVar4->focus_next = pQVar5;
  }
  return;
}

Assistant:

void QWidgetPrivate::reparentFocusChildren(FocusDirection direction)
{
    Q_Q(QWidget);

    // separate the focus chain into new (children of myself) and old (the rest)
    QWidget *firstOld = nullptr;
    QWidget *lastOld = nullptr; // last in the old list
    QWidget *lastNew = q; // last in the new list
    bool prevWasNew = true;
    QWidget *widget = nextPrevElementInFocusChain(direction);

    // For efficiency, do not maintain the list invariant inside the loop.
    // Append items to the relevant list, and we optimize by not changing pointers,
    // when subsequent items are going into the same list.
    while (widget != q) {
        bool currentIsNew = q->isAncestorOf(widget);
        if (currentIsNew) {
            if (!prevWasNew) {
                // previous was old => append to new list
                FOCUS_NEXT(lastNew) = widget;
                FOCUS_PREV(widget) = lastNew;
            }
            lastNew = widget;
        } else {
            if (prevWasNew) {
                // prev was new => append to old list, if it exists
                if (lastOld) {
                    FOCUS_NEXT(lastOld) = widget;
                    FOCUS_PREV(widget) = lastOld;
                } else {
                    // start the old list
                    firstOld = widget;
                }
            }
            lastOld = widget;
        }
        widget = widget->d_func()->nextPrevElementInFocusChain(direction);
        prevWasNew = currentIsNew;
    }

    // repair old list:
    if (firstOld) {
        FOCUS_NEXT(lastOld) = firstOld;
        FOCUS_PREV(firstOld) = lastOld;
    }

    if (!q->isWindow()) {
        QWidget *topLevel = q->window();
        // insert new chain into toplevel's chain
        QWidget *prev = FOCUS_PREV(topLevel);
        FOCUS_PREV(topLevel) = lastNew;
        FOCUS_NEXT(prev) = q;
        FOCUS_PREV(q) = prev;
        FOCUS_NEXT(lastNew) = topLevel;
    } else {
        // repair new list
        FOCUS_NEXT(lastNew) = q;
        FOCUS_PREV(q) = lastNew;
    }
}